

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

opj_thread_pool_t * opj_thread_pool_create(int num_threads)

{
  opj_thread_pool_t *tp;
  opj_mutex_t *poVar1;
  opj_cond_t *poVar2;
  opj_worker_thread_t *poVar3;
  opj_thread_t *poVar4;
  opj_tls_t *poVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  tp = (opj_thread_pool_t *)opj_calloc(1,0x58);
  if (tp != (opj_thread_pool_t *)0x0) {
    tp->state = OPJWTS_OK;
    if (num_threads < 1) {
      poVar5 = opj_tls_new();
      tp->tls = poVar5;
      if (poVar5 != (opj_tls_t *)0x0) {
        return tp;
      }
    }
    else {
      poVar1 = opj_mutex_create();
      tp->mutex = poVar1;
      if (poVar1 != (opj_mutex_t *)0x0) {
        poVar2 = opj_cond_create();
        tp->cond = poVar2;
        if (poVar2 != (opj_cond_t *)0x0) {
          poVar3 = (opj_worker_thread_t *)opj_calloc((ulong)(uint)num_threads,0x28);
          tp->worker_threads = poVar3;
          if (poVar3 != (opj_worker_thread_t *)0x0) {
            tp->worker_threads_count = num_threads;
            lVar8 = (ulong)(uint)num_threads * 0x28;
            iVar6 = 0;
            for (lVar7 = 0; lVar8 - lVar7 != 0; lVar7 = lVar7 + 0x28) {
              *(opj_thread_pool_t **)((long)&poVar3->tp + lVar7) = tp;
              poVar1 = opj_mutex_create();
              *(opj_mutex_t **)((long)&tp->worker_threads->mutex + lVar7) = poVar1;
              if (poVar1 == (opj_mutex_t *)0x0) {
LAB_001081d8:
                tp->worker_threads_count = iVar6;
                break;
              }
              poVar2 = opj_cond_create();
              poVar3 = tp->worker_threads;
              *(opj_cond_t **)((long)&poVar3->cond + lVar7) = poVar2;
              if (poVar2 == (opj_cond_t *)0x0) {
                opj_mutex_destroy(*(opj_mutex_t **)((long)&poVar3->mutex + lVar7));
                goto LAB_001081d8;
              }
              *(undefined4 *)((long)&poVar3->marked_as_waiting + lVar7) = 0;
              poVar4 = opj_thread_create(opj_worker_thread_function,
                                         (void *)((long)&poVar3->tp + lVar7));
              poVar3 = tp->worker_threads;
              *(opj_thread_t **)((long)&poVar3->thread + lVar7) = poVar4;
              if (poVar4 == (opj_thread_t *)0x0) {
                opj_mutex_destroy(*(opj_mutex_t **)((long)&poVar3->mutex + lVar7));
                opj_cond_destroy(*(opj_cond_t **)((long)&tp->worker_threads->cond + lVar7));
                goto LAB_001081d8;
              }
              iVar6 = iVar6 + 1;
            }
            pthread_mutex_lock((pthread_mutex_t *)tp->mutex);
            while (tp->waiting_worker_thread_count < tp->worker_threads_count) {
              pthread_cond_wait((pthread_cond_t *)tp->cond,(pthread_mutex_t *)tp->mutex);
            }
            pthread_mutex_unlock((pthread_mutex_t *)tp->mutex);
            if ((lVar8 - lVar7 == 0) && (tp->state != OPJWTS_ERROR)) {
              return tp;
            }
          }
        }
        opj_thread_pool_destroy(tp);
        return (opj_thread_pool_t *)0x0;
      }
    }
    opj_free(tp);
  }
  return (opj_thread_pool_t *)0x0;
}

Assistant:

opj_thread_pool_t* opj_thread_pool_create(int num_threads)
{
    opj_thread_pool_t* tp;

    tp = (opj_thread_pool_t*) opj_calloc(1, sizeof(opj_thread_pool_t));
    if (!tp) {
        return NULL;
    }
    tp->state = OPJWTS_OK;

    if (num_threads <= 0) {
        tp->tls = opj_tls_new();
        if (!tp->tls) {
            opj_free(tp);
            tp = NULL;
        }
        return tp;
    }

    tp->mutex = opj_mutex_create();
    if (!tp->mutex) {
        opj_free(tp);
        return NULL;
    }
    if (!opj_thread_pool_setup(tp, num_threads)) {
        opj_thread_pool_destroy(tp);
        return NULL;
    }
    return tp;
}